

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int memjrnlRead(sqlite3_file *pJfd,void *zBuf,int iAmt,sqlite_int64 iOfst)

{
  int iVar1;
  sqlite3_io_methods *psVar2;
  long lVar3;
  int iVar4;
  sqlite3_io_methods *psVar5;
  
  psVar2 = (sqlite3_io_methods *)(iAmt + iOfst);
  iVar1 = 0x20a;
  if ((long)psVar2 <= (long)pJfd[3].pMethods) {
    if ((iOfst == 0) || (pJfd[5].pMethods != (sqlite3_io_methods *)iOfst)) {
      psVar5 = (sqlite3_io_methods *)(pJfd + 2);
      lVar3 = 0;
      do {
        psVar5 = *(sqlite3_io_methods **)psVar5;
        if (psVar5 == (sqlite3_io_methods *)0x0) break;
        lVar3 = lVar3 + *(int *)&pJfd[1].pMethods;
      } while (lVar3 <= iOfst);
    }
    else {
      psVar5 = pJfd[6].pMethods;
    }
    lVar3 = iOfst % (long)*(int *)&pJfd[1].pMethods;
    do {
      iVar4 = *(int *)&pJfd[1].pMethods - (int)lVar3;
      iVar1 = iVar4;
      if (iAmt < iVar4) {
        iVar1 = iAmt;
      }
      memcpy(zBuf,(void *)((long)&psVar5->xClose + (long)(int)lVar3),(long)iVar1);
      iAmt = iAmt - iVar4;
      if ((iAmt < 0) || (psVar5 = *(sqlite3_io_methods **)psVar5, iAmt == 0)) break;
      zBuf = (void *)((long)zBuf + (long)iVar1);
      lVar3 = 0;
    } while (psVar5 != (sqlite3_io_methods *)0x0);
    if (psVar5 == (sqlite3_io_methods *)0x0) {
      psVar2 = (sqlite3_io_methods *)0x0;
    }
    pJfd[5].pMethods = psVar2;
    pJfd[6].pMethods = psVar5;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int memjrnlRead(
  sqlite3_file *pJfd,    /* The journal file from which to read */
  void *zBuf,            /* Put the results here */
  int iAmt,              /* Number of bytes to read */
  sqlite_int64 iOfst     /* Begin reading at this offset */
){
  MemJournal *p = (MemJournal *)pJfd;
  u8 *zOut = zBuf;
  int nRead = iAmt;
  int iChunkOffset;
  FileChunk *pChunk;

  if( (iAmt+iOfst)>p->endpoint.iOffset ){
    return SQLITE_IOERR_SHORT_READ;
  }
  assert( p->readpoint.iOffset==0 || p->readpoint.pChunk!=0 );
  if( p->readpoint.iOffset!=iOfst || iOfst==0 ){
    sqlite3_int64 iOff = 0;
    for(pChunk=p->pFirst;
        ALWAYS(pChunk) && (iOff+p->nChunkSize)<=iOfst;
        pChunk=pChunk->pNext
    ){
      iOff += p->nChunkSize;
    }
  }else{
    pChunk = p->readpoint.pChunk;
    assert( pChunk!=0 );
  }

  iChunkOffset = (int)(iOfst%p->nChunkSize);
  do {
    int iSpace = p->nChunkSize - iChunkOffset;
    int nCopy = MIN(nRead, (p->nChunkSize - iChunkOffset));
    memcpy(zOut, (u8*)pChunk->zChunk + iChunkOffset, nCopy);
    zOut += nCopy;
    nRead -= iSpace;
    iChunkOffset = 0;
  } while( nRead>=0 && (pChunk=pChunk->pNext)!=0 && nRead>0 );
  p->readpoint.iOffset = pChunk ? iOfst+iAmt : 0;
  p->readpoint.pChunk = pChunk;

  return SQLITE_OK;
}